

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

t_symbol * get_object_type(t_object *obj)

{
  byte bVar1;
  _binbuf *b;
  _binbuf *bb;
  t_symbol *s;
  t_object *obj_local;
  
  bb = (_binbuf *)0x0;
  if (obj == (t_object *)0x0) {
    obj_local = (t_object *)0x0;
  }
  else {
    bVar1 = obj->field_0x2e & 3;
    s = (t_symbol *)obj;
    if ((obj->field_0x2e & 3) == 0) {
      obj_local = (t_object *)gensym("text");
    }
    else if (bVar1 == 1) {
      obj_local = (t_object *)gensym("obj");
    }
    else if (bVar1 == 2) {
      obj_local = (t_object *)gensym("msg");
    }
    else {
      b = binbuf_new();
      gobj_save((t_gobj *)s,b);
      binbuf_getpos(b,(int *)0x0,(int *)0x0,(t_symbol **)&bb);
      binbuf_free(b);
      obj_local = (t_object *)bb;
    }
  }
  return (t_symbol *)obj_local;
}

Assistant:

static t_symbol*get_object_type(t_object *obj)
{
    t_symbol *s=0;
    t_binbuf *bb=0;
    if(!obj)
        return 0;
    switch(obj->te_type) {
    case T_OBJECT:
        return gensym("obj");
    case T_MESSAGE:
        return gensym("msg");
    case T_TEXT:
        return gensym("text");
    default:
            /* detecting the type of a gatom by using it's save function */
        bb=binbuf_new();
        gobj_save(&obj->te_g, bb);
        binbuf_getpos(bb, 0, 0, &s);
        binbuf_free(bb);
        return s;
    }
    return 0;
}